

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32ppcbe.c
# Opt level: O2

void make_ddrelocs(GlobalVars *gv,LinkedSection *ddrel)

{
  LinkedSection *pLVar1;
  node *pnVar2;
  node *pnVar3;
  uint32_t x;
  node *vp;
  node *pnVar4;
  
  x = 0;
  pLVar1 = find_lnksec(gv,".sdata",'\0','\0','\0','\0');
  if (pLVar1 != (LinkedSection *)0x0) {
    x = 0;
    pnVar2 = (pLVar1->relocs).first;
    while (pnVar4 = pnVar2, pnVar2 = pnVar4->next, pnVar2 != (node *)0x0) {
      if ((LinkedSection *)pnVar4[1].pred == pLVar1) {
        x = x + (*(char *)&pnVar4[3].pred == '\x01');
      }
    }
  }
  pnVar4 = (node *)((ulong)(x + 1) << 2);
  pnVar2 = (node *)alloc((size_t)pnVar4);
  write32be(pnVar2,x);
  if (pLVar1 != (LinkedSection *)0x0) {
    pnVar3 = (node *)&pLVar1->relocs;
    vp = pnVar2;
    do {
      vp = (node *)((long)&vp->next + 4);
      do {
        pnVar3 = pnVar3->next;
        if (pnVar3->next == (node *)0x0) goto LAB_0011dd07;
      } while (((LinkedSection *)pnVar3[1].pred != pLVar1) || (*(char *)&pnVar3[3].pred != '\x01'));
      write32be(vp,*(uint32_t *)&pnVar3[2].next);
    } while( true );
  }
LAB_0011dd07:
  ddrel->data = (uint8_t *)pnVar2;
  ddrel->filesize = (unsigned_long)pnVar4;
  ddrel->size = (unsigned_long)pnVar4;
  pnVar3 = (ddrel->sections).first;
  if (pnVar3 != (node *)0x0) {
    pnVar3[4].pred = pnVar2;
    pnVar3[5].next = pnVar4;
  }
  return;
}

Assistant:

static void make_ddrelocs(struct GlobalVars *gv,struct LinkedSection *ddrel)
{
  struct LinkedSection *sdata;
  struct Section *sec;
  struct Reloc *rel;
  uint8_t *table;
  uint32_t *p;
  unsigned long size;
  uint32_t nrelocs = 0;

  if (sdata = find_lnksec(gv,sdata_name,0,0,0,0)) {
    for (rel=(struct Reloc *)sdata->relocs.first;
         rel->n.next!=NULL; rel=(struct Reloc *)rel->n.next) {
      if (rel->relocsect.lnk==sdata && rel->rtype==R_ABS)
        nrelocs++;
    }
  }

  size = (nrelocs+1) * sizeof(uint32_t);
  table = alloc(size);
  p = (uint32_t *)table;
  write32be(p++,nrelocs);

  if (sdata) {
    for (rel=(struct Reloc *)sdata->relocs.first;
         rel->n.next!=NULL; rel=(struct Reloc *)rel->n.next) {
      if (rel->relocsect.lnk==sdata && rel->rtype==R_ABS)
        write32be(p++,(uint32_t)rel->offset);
    }
  }

  ddrel->data = table;
  ddrel->size = ddrel->filesize = size;
  if (sec = (struct Section *)ddrel->sections.first) {
    sec->data = table;
    sec->size = size;
  }
}